

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O1

void __thiscall
cnn::Tensor::load<boost::archive::text_iarchive>(Tensor *this,text_iarchive *ar,uint param_2)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  float *t;
  void *x;
  ulong uVar10;
  ushort uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  float *local_20;
  
  boost::serialization::
  singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_cnn::Dim>_>::
  get_instance();
  boost::archive::detail::basic_iarchive::load_object(ar,(basic_iserializer *)this);
  uVar10 = (ulong)(this->d).nd;
  if (uVar10 == 0) {
    iVar7 = 1;
  }
  else {
    auVar13 = vpbroadcastq_avx512f();
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar9 = 0;
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar17 = vmovdqa64_avx512f(auVar14);
      auVar14 = vpbroadcastq_avx512f();
      auVar18 = vporq_avx512f(auVar14,auVar15);
      auVar14 = vporq_avx512f(auVar14,auVar16);
      uVar4 = vpcmpuq_avx512f(auVar14,auVar13,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar18,auVar13,2);
      bVar6 = (byte)uVar4;
      uVar11 = CONCAT11(bVar6,bVar5);
      auVar14 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this->d).d + uVar9));
      auVar18._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar14._4_4_;
      auVar18._0_4_ = (uint)(bVar5 & 1) * auVar14._0_4_;
      auVar18._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar14._8_4_;
      auVar18._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar14._12_4_;
      auVar18._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar14._16_4_;
      auVar18._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar14._20_4_;
      auVar18._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar14._24_4_;
      auVar18._28_4_ = (uint)((byte)(uVar11 >> 7) & 1) * auVar14._28_4_;
      auVar18._32_4_ = (uint)(bVar6 & 1) * auVar14._32_4_;
      auVar18._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar14._36_4_;
      auVar18._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar14._40_4_;
      auVar18._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar14._44_4_;
      auVar18._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar14._48_4_;
      auVar18._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar14._52_4_;
      auVar18._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar14._56_4_;
      auVar18._60_4_ = (uint)(bVar6 >> 7) * auVar14._60_4_;
      auVar14 = vpmulld_avx512f(auVar18,auVar17);
      uVar9 = uVar9 + 0x10;
    } while ((uVar10 + 0xf & 0x1fffffff0) != uVar9);
    auVar13 = vmovdqa32_avx512f(auVar14);
    auVar14._0_4_ = (uint)(bVar5 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar17._0_4_;
    bVar1 = (bool)((byte)(uVar11 >> 1) & 1);
    auVar14._4_4_ = (uint)bVar1 * auVar13._4_4_ | (uint)!bVar1 * auVar17._4_4_;
    bVar1 = (bool)((byte)(uVar11 >> 2) & 1);
    auVar14._8_4_ = (uint)bVar1 * auVar13._8_4_ | (uint)!bVar1 * auVar17._8_4_;
    bVar1 = (bool)((byte)(uVar11 >> 3) & 1);
    auVar14._12_4_ = (uint)bVar1 * auVar13._12_4_ | (uint)!bVar1 * auVar17._12_4_;
    bVar1 = (bool)((byte)(uVar11 >> 4) & 1);
    auVar14._16_4_ = (uint)bVar1 * auVar13._16_4_ | (uint)!bVar1 * auVar17._16_4_;
    bVar1 = (bool)((byte)(uVar11 >> 5) & 1);
    auVar14._20_4_ = (uint)bVar1 * auVar13._20_4_ | (uint)!bVar1 * auVar17._20_4_;
    bVar1 = (bool)((byte)(uVar11 >> 6) & 1);
    auVar14._24_4_ = (uint)bVar1 * auVar13._24_4_ | (uint)!bVar1 * auVar17._24_4_;
    bVar1 = (bool)((byte)(uVar11 >> 7) & 1);
    auVar14._28_4_ = (uint)bVar1 * auVar13._28_4_ | (uint)!bVar1 * auVar17._28_4_;
    auVar14._32_4_ = (uint)(bVar6 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar17._32_4_;
    bVar1 = (bool)(bVar6 >> 1 & 1);
    auVar14._36_4_ = (uint)bVar1 * auVar13._36_4_ | (uint)!bVar1 * auVar17._36_4_;
    bVar1 = (bool)(bVar6 >> 2 & 1);
    auVar14._40_4_ = (uint)bVar1 * auVar13._40_4_ | (uint)!bVar1 * auVar17._40_4_;
    bVar1 = (bool)(bVar6 >> 3 & 1);
    auVar14._44_4_ = (uint)bVar1 * auVar13._44_4_ | (uint)!bVar1 * auVar17._44_4_;
    bVar1 = (bool)(bVar6 >> 4 & 1);
    auVar14._48_4_ = (uint)bVar1 * auVar13._48_4_ | (uint)!bVar1 * auVar17._48_4_;
    bVar1 = (bool)(bVar6 >> 5 & 1);
    auVar14._52_4_ = (uint)bVar1 * auVar13._52_4_ | (uint)!bVar1 * auVar17._52_4_;
    bVar1 = (bool)(bVar6 >> 6 & 1);
    auVar14._56_4_ = (uint)bVar1 * auVar13._56_4_ | (uint)!bVar1 * auVar17._56_4_;
    auVar14._60_4_ =
         (uint)(bVar6 >> 7) * auVar13._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar17._60_4_;
    auVar12 = vextracti64x4_avx512f(auVar14,1);
    auVar13 = vpmulld_avx512f(auVar14,ZEXT3264(auVar12));
    auVar2 = vpmulld_avx(auVar13._0_16_,auVar13._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    iVar7 = auVar2._0_4_;
  }
  iVar7 = posix_memalign(&local_20,0x20,(ulong)(iVar7 * (this->d).bd) << 2);
  if (iVar7 != 0) {
    local_20 = (float *)0x0;
  }
  this->v = local_20;
  uVar10 = (ulong)(this->d).nd;
  if (uVar10 == 0) {
    iVar7 = 1;
  }
  else {
    auVar13 = vpbroadcastq_avx512f();
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar9 = 0;
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar17 = vmovdqa64_avx512f(auVar14);
      auVar14 = vpbroadcastq_avx512f();
      auVar18 = vporq_avx512f(auVar14,auVar15);
      auVar14 = vporq_avx512f(auVar14,auVar16);
      uVar4 = vpcmpuq_avx512f(auVar14,auVar13,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar18,auVar13,2);
      bVar6 = (byte)uVar4;
      uVar11 = CONCAT11(bVar6,bVar5);
      auVar14 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this->d).d + uVar9));
      auVar19._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar14._4_4_;
      auVar19._0_4_ = (uint)(bVar5 & 1) * auVar14._0_4_;
      auVar19._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar14._8_4_;
      auVar19._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar14._12_4_;
      auVar19._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar14._16_4_;
      auVar19._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar14._20_4_;
      auVar19._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar14._24_4_;
      auVar19._28_4_ = (uint)((byte)(uVar11 >> 7) & 1) * auVar14._28_4_;
      auVar19._32_4_ = (uint)(bVar6 & 1) * auVar14._32_4_;
      auVar19._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar14._36_4_;
      auVar19._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar14._40_4_;
      auVar19._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar14._44_4_;
      auVar19._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar14._48_4_;
      auVar19._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar14._52_4_;
      auVar19._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar14._56_4_;
      auVar19._60_4_ = (uint)(bVar6 >> 7) * auVar14._60_4_;
      auVar14 = vpmulld_avx512f(auVar19,auVar17);
      uVar9 = uVar9 + 0x10;
    } while ((uVar10 + 0xf & 0x1fffffff0) != uVar9);
    auVar13 = vmovdqa32_avx512f(auVar14);
    auVar15._0_4_ = (uint)(bVar5 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar17._0_4_;
    bVar1 = (bool)((byte)(uVar11 >> 1) & 1);
    auVar15._4_4_ = (uint)bVar1 * auVar13._4_4_ | (uint)!bVar1 * auVar17._4_4_;
    bVar1 = (bool)((byte)(uVar11 >> 2) & 1);
    auVar15._8_4_ = (uint)bVar1 * auVar13._8_4_ | (uint)!bVar1 * auVar17._8_4_;
    bVar1 = (bool)((byte)(uVar11 >> 3) & 1);
    auVar15._12_4_ = (uint)bVar1 * auVar13._12_4_ | (uint)!bVar1 * auVar17._12_4_;
    bVar1 = (bool)((byte)(uVar11 >> 4) & 1);
    auVar15._16_4_ = (uint)bVar1 * auVar13._16_4_ | (uint)!bVar1 * auVar17._16_4_;
    bVar1 = (bool)((byte)(uVar11 >> 5) & 1);
    auVar15._20_4_ = (uint)bVar1 * auVar13._20_4_ | (uint)!bVar1 * auVar17._20_4_;
    bVar1 = (bool)((byte)(uVar11 >> 6) & 1);
    auVar15._24_4_ = (uint)bVar1 * auVar13._24_4_ | (uint)!bVar1 * auVar17._24_4_;
    bVar1 = (bool)((byte)(uVar11 >> 7) & 1);
    auVar15._28_4_ = (uint)bVar1 * auVar13._28_4_ | (uint)!bVar1 * auVar17._28_4_;
    auVar15._32_4_ = (uint)(bVar6 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar17._32_4_;
    bVar1 = (bool)(bVar6 >> 1 & 1);
    auVar15._36_4_ = (uint)bVar1 * auVar13._36_4_ | (uint)!bVar1 * auVar17._36_4_;
    bVar1 = (bool)(bVar6 >> 2 & 1);
    auVar15._40_4_ = (uint)bVar1 * auVar13._40_4_ | (uint)!bVar1 * auVar17._40_4_;
    bVar1 = (bool)(bVar6 >> 3 & 1);
    auVar15._44_4_ = (uint)bVar1 * auVar13._44_4_ | (uint)!bVar1 * auVar17._44_4_;
    bVar1 = (bool)(bVar6 >> 4 & 1);
    auVar15._48_4_ = (uint)bVar1 * auVar13._48_4_ | (uint)!bVar1 * auVar17._48_4_;
    bVar1 = (bool)(bVar6 >> 5 & 1);
    auVar15._52_4_ = (uint)bVar1 * auVar13._52_4_ | (uint)!bVar1 * auVar17._52_4_;
    bVar1 = (bool)(bVar6 >> 6 & 1);
    auVar15._56_4_ = (uint)bVar1 * auVar13._56_4_ | (uint)!bVar1 * auVar17._56_4_;
    auVar15._60_4_ =
         (uint)(bVar6 >> 7) * auVar13._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar17._60_4_;
    auVar12 = vextracti64x4_avx512f(auVar15,1);
    auVar13 = vpmulld_avx512f(auVar15,ZEXT3264(auVar12));
    auVar2 = vpmulld_avx(auVar13._0_16_,auVar13._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    iVar7 = auVar2._0_4_;
  }
  uVar8 = iVar7 * (this->d).bd;
  if (uVar8 != 0) {
    uVar10 = (ulong)uVar8;
    t = local_20;
    do {
      boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
      load<float>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
                  &ar->field_0x28,t);
      uVar10 = uVar10 - 1;
      t = t + 1;
    } while (uVar10 != 0);
  }
  return;
}

Assistant:

void load(Archive& ar, const unsigned int) {
    ar & d;
    // TODO(mem) - load device and use it to create memory allocator
    // Devices should probably know how to load and save data to disk
#if HAVE_CUDA
    CUDA_CHECK(cudaMalloc(&v, d.size() * sizeof(float)));
    float* vc = static_cast<float*>(std::malloc(d.size() * sizeof(float)));
    ar & boost::serialization::make_array(vc, d.size());
    CUDA_CHECK(cudaMemcpyAsync(v, vc, d.size() * sizeof(float), cudaMemcpyHostToDevice));
#else
    v = static_cast<float*>(_mm_malloc(d.size() * sizeof(float), 32));
    ar & boost::serialization::make_array(v, d.size());
#endif
  }